

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  XercesDOMParser *pXVar11;
  ostream *poVar12;
  TypeInfo *this;
  int iVar13;
  char *pcVar14;
  TypeInfo ti;
  XStr local_38;
  
  TypeInfo::TypeInfo(&ti);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)param_2);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  ti.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar1 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar1);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  ti.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.doc == (DOMDocument *)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x35c);
    pcVar14 = "was not carried out";
    poVar12 = std::operator<<(poVar12,"was not carried out");
    bVar1 = true;
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    pcVar14 = (char *)0x1;
    bVar1 = TypeInfo::testInBuiltTypesOnAttributes(&ti,true);
    bVar2 = TypeInfo::testInBuiltTypesOnElements(&ti);
    bVar3 = TypeInfo::testSimpleDerived(&ti);
    bVar4 = TypeInfo::testComplexTypes(&ti);
    bVar5 = TypeInfo::testUnions(&ti);
    bVar6 = TypeInfo::testAnonymous(&ti);
    bVar7 = TypeInfo::testXsiTypes(&ti);
    bVar8 = TypeInfo::testAnys(&ti);
    bVar9 = TypeInfo::testInvaild(&ti);
    bVar1 = (bVar8 && bVar9) &&
            (((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2)));
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  ti.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar2 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar2);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar2);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar2);
  XStr::XStr(&local_38,"SGXMLScanner");
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)pXVar11);
  XStr::~XStr(&local_38);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  ti.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.doc == (DOMDocument *)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x37e);
    pcVar14 = "was not carried out";
    poVar12 = std::operator<<(poVar12,"was not carried out");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    pcVar14 = (char *)0x0;
    bVar2 = TypeInfo::testInBuiltTypesOnAttributes(&ti,false);
    bVar3 = TypeInfo::testInBuiltTypesOnElements(&ti);
    bVar4 = TypeInfo::testSimpleDerived(&ti);
    bVar5 = TypeInfo::testComplexTypes(&ti);
    bVar6 = TypeInfo::testUnions(&ti);
    bVar7 = TypeInfo::testAnonymous(&ti);
    bVar8 = TypeInfo::testXsiTypes(&ti);
    bVar9 = TypeInfo::testAnys(&ti);
    bVar10 = TypeInfo::testInvaild(&ti);
    bVar1 = (((bVar7 && bVar8) && bVar9) && bVar10) &&
            (((bVar4 && bVar5) && bVar6) && ((bVar2 && bVar3) && bVar1));
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  ti.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(SUB81(pXVar11,0));
  pcVar14 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  ti.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.doc == (DOMDocument *)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x396);
    pcVar14 = "was not carried out";
    poVar12 = std::operator<<(poVar12,"was not carried out");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    bVar2 = TypeInfo::testDTD(&ti);
    bVar1 = bVar2 && bVar1;
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  ti.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(SUB81(pXVar11,0));
  XStr::XStr(&local_38,"DGXMLScanner");
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)pXVar11);
  XStr::~XStr(&local_38);
  pcVar14 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  ti.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.doc == (DOMDocument *)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x3af);
    pcVar14 = "was not carried out";
    poVar12 = std::operator<<(poVar12,"was not carried out");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    bVar2 = TypeInfo::testDTD(&ti);
    bVar1 = bVar2 && bVar1;
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  ti.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar2 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar2);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar2);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar2);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  ti.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (ti.doc == (DOMDocument *)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"DOMTypeInfo test at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x3c7);
    poVar12 = std::operator<<(poVar12,"was not carried out");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    bVar2 = TypeInfo::combinedTest(&ti);
    bVar1 = bVar2 && bVar1;
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  if (bVar1) {
    this = (TypeInfo *)std::operator<<((ostream *)&std::cerr,"Test Run Successfully");
    std::endl<char,std::char_traits<char>>((ostream *)this);
    iVar13 = 0;
  }
  else {
    this = (TypeInfo *)std::operator<<((ostream *)&std::cerr,"test failed");
    std::endl<char,std::char_traits<char>>((ostream *)this);
    iVar13 = 4;
  }
  TypeInfo::~TypeInfo(this);
  return iVar13;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
    bool passed = true;

    TypeInfo ti;

    try {
        //first the combined DTD/Schema scanner
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/TypeInfo.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfo.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(true);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    //lets do the same for the just schema scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->useScanner(X("SGXMLScanner"));
        ti.parser->parse("data/TypeInfoNoDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoNoDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(false);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //now default for DTD
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //and specific scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->useScanner(X("DGXMLScanner"));
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &=  ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/combined.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/combined.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.combinedTest();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    if (!passed) {
        std::cerr << "test failed" << std::endl;
        return 4;
    }

    std::cerr << "Test Run Successfully" << std::endl;
    return 0;
}